

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

double signx(double x)

{
  undefined8 local_18;
  double sgn;
  double x_local;
  
  if (x < 0.0) {
    local_18 = -1.0;
  }
  else {
    local_18 = 1.0;
  }
  return local_18;
}

Assistant:

double signx(double x) {
	double sgn;
	if (x >= 0.) {
		sgn = 1.0;
	}
	else {
		sgn = -1.0;
	}
	return sgn;
}